

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::read_decimal_fraction
          (basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
           *this,string_type *result,error_code *ec)

{
  bool bVar1;
  cbor_major_type cVar2;
  uint8_t uVar3;
  char_result<unsigned_char> cVar4;
  int iVar5;
  size_t sVar6;
  type_conflict2 tVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  error_code *in_RDX;
  char in_SIL;
  long in_RDI;
  bigint n_1;
  bigint n;
  uint8_t tag;
  uint8_t b;
  int64_t val_1;
  uint64_t val;
  string_type str;
  int64_t exponent;
  char_result<unsigned_char> c;
  size_t size;
  binary_iterator_source<(anonymous_namespace)::MyIterator> *in_stack_fffffffffffffe48;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffe50;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffe58;
  cbor_errc __e;
  error_code *in_stack_fffffffffffffe60;
  basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  *in_stack_fffffffffffffe68;
  binary_iterator_source<(anonymous_namespace)::MyIterator> *in_stack_fffffffffffffe70;
  basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  int max_exp;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe88;
  uchar *in_stack_fffffffffffffe90;
  error_code *in_stack_fffffffffffffea0;
  basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  *in_stack_fffffffffffffea8;
  error_code *in_stack_ffffffffffffff00;
  byte_string_type *in_stack_ffffffffffffff08;
  basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  uint8_t local_79;
  string local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  unsigned_long in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  uint8_t local_22;
  
  sVar6 = get_size(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    return;
  }
  if (sVar6 != 2) {
    std::error_code::operator=
              (in_stack_fffffffffffffe60,(cbor_errc)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    *(undefined1 *)(in_RDI + 8) = 0;
    return;
  }
  cVar4 = binary_iterator_source<(anonymous_namespace)::MyIterator>::peek(in_stack_fffffffffffffe48)
  ;
  if (((ushort)cVar4 & 0x100) != 0) {
    std::error_code::operator=
              (in_stack_fffffffffffffe60,(cbor_errc)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    *(undefined1 *)(in_RDI + 8) = 0;
    return;
  }
  local_22 = cVar4.value;
  cVar2 = get_major_type(local_22);
  if (cVar2 == unsigned_integer) {
    local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               get_uint64_value(in_stack_fffffffffffffe78,(error_code *)in_stack_fffffffffffffe70);
    bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
    if (bVar1) {
      return;
    }
  }
  else {
    if (cVar2 != negative_integer) {
      std::error_code::operator=
                (in_stack_fffffffffffffe60,(cbor_errc)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      *(undefined1 *)(in_RDI + 8) = 0;
      return;
    }
    local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               get_int64_value(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
    if (bVar1) {
      return;
    }
  }
  std::__cxx11::string::string(local_50,(allocator *)(in_RDI + 0x28));
  cVar4 = binary_iterator_source<(anonymous_namespace)::MyIterator>::peek(in_stack_fffffffffffffe48)
  ;
  if (((ushort)cVar4 & 0x100) != 0) {
    std::error_code::operator=
              (in_stack_fffffffffffffe60,(cbor_errc)((ulong)in_stack_fffffffffffffe58 >> 0x20));
    *(undefined1 *)(in_RDI + 8) = 0;
    goto LAB_003d84ea;
  }
  local_22 = cVar4.value;
  cVar2 = get_major_type(local_22);
  if (cVar2 == unsigned_integer) {
    get_uint64_value(in_stack_fffffffffffffe78,(error_code *)in_stack_fffffffffffffe70);
    __e = (cbor_errc)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
    if (bVar1) goto LAB_003d84ea;
    jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else if (cVar2 == negative_integer) {
    get_int64_value(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    __e = (cbor_errc)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
    if (bVar1) goto LAB_003d84ea;
    jsoncons::detail::from_integer<long,std::__cxx11::string>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    if (cVar2 != semantic_tag) {
      std::error_code::operator=
                (in_stack_fffffffffffffe60,(cbor_errc)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      *(undefined1 *)(in_RDI + 8) = 0;
      goto LAB_003d84ea;
    }
    tVar7 = binary_iterator_source<(anonymous_namespace)::MyIterator>::read<std::input_iterator_tag>
                      (in_stack_fffffffffffffe70,(value_type *)in_stack_fffffffffffffe68,
                       (size_t)in_stack_fffffffffffffe60);
    if (tVar7 == 0) {
      std::error_code::operator=
                (in_stack_fffffffffffffe60,(cbor_errc)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      *(undefined1 *)(in_RDI + 8) = 0;
      goto LAB_003d84ea;
    }
    uVar3 = get_additional_information_value(local_79);
    cVar4 = binary_iterator_source<(anonymous_namespace)::MyIterator>::peek
                      (in_stack_fffffffffffffe48);
    if (((ushort)cVar4 & 0x100) != 0) {
      std::error_code::operator=
                (in_stack_fffffffffffffe60,(cbor_errc)((ulong)in_stack_fffffffffffffe58 >> 0x20));
      *(undefined1 *)(in_RDI + 8) = 0;
      goto LAB_003d84ea;
    }
    local_22 = cVar4.value;
    cVar2 = get_major_type(local_22);
    if (cVar2 == byte_string) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3d80b8);
      read_byte_string(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00
                      );
      bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
      if (bVar1) {
        *(undefined1 *)(in_RDI + 8) = 0;
        goto LAB_003d84ea;
      }
      if (uVar3 == '\x02') {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3d8131);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xa0));
        basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                  (in_stack_ffffffffffffff1c,(uint8_t *)in_stack_ffffffffffffff10,
                   (size_t)in_stack_ffffffffffffff08);
        basic_bigint<std::allocator<unsigned_char>>::
        write_string<char,std::char_traits<char>,std::allocator<char>>
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffe50);
      }
      else if (uVar3 == '\x03') {
        in_stack_fffffffffffffe88 =
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xa0);
        in_stack_fffffffffffffe90 =
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x3d81d5);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_stack_fffffffffffffe88);
        basic_bigint<std::allocator<unsigned_char>_>::from_bytes_be
                  (in_stack_ffffffffffffff1c,(uint8_t *)in_stack_ffffffffffffff10,
                   (size_t)in_stack_ffffffffffffff08);
        basic_bigint<std::allocator<unsigned_char>_>::basic_bigint<int>
                  ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe70,
                   (int)((ulong)in_stack_fffffffffffffe68 >> 0x20),in_stack_fffffffffffffe60);
        jsoncons::operator-((basic_bigint<std::allocator<unsigned_char>_> *)
                            in_stack_fffffffffffffe68,
                            (basic_bigint<std::allocator<unsigned_char>_> *)
                            in_stack_fffffffffffffe60);
        basic_bigint<std::allocator<unsigned_char>_>::operator=
                  ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffe58);
        basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffe50);
        basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffe50);
        basic_bigint<std::allocator<unsigned_char>>::
        write_string<char,std::char_traits<char>,std::allocator<char>>
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffe50);
      }
    }
    __e = (cbor_errc)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  }
  uVar8 = std::__cxx11::string::size();
  iVar5 = std::numeric_limits<int>::max();
  if ((uVar8 < (ulong)(long)iVar5) &&
     (pbVar11 = local_30, iVar5 = std::numeric_limits<int>::max(), (long)pbVar11 < (long)iVar5)) {
    iVar5 = std::numeric_limits<int>::min();
    max_exp = (int)((ulong)pbVar11 >> 0x20);
    if ((long)iVar5 < (long)local_30) {
      lVar9 = std::__cxx11::string::size();
      if (lVar9 == 0) {
        std::error_code::operator=(in_stack_fffffffffffffe60,__e);
        *(undefined1 *)(in_RDI + 8) = 0;
      }
      else {
        pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
        if (*pcVar10 == '-') {
          std::__cxx11::string::push_back(in_SIL);
          std::__cxx11::string::c_str();
          std::__cxx11::string::size();
          jsoncons::detail::prettify_string<std::__cxx11::string>
                    ((char *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
                     (int)(uVar8 >> 0x20),(int)uVar8,max_exp,local_30);
        }
        else {
          std::__cxx11::string::c_str();
          std::__cxx11::string::size();
          jsoncons::detail::prettify_string<std::__cxx11::string>
                    ((char *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
                     (int)(uVar8 >> 0x20),(int)uVar8,max_exp,local_30);
        }
      }
      goto LAB_003d84ea;
    }
  }
  std::error_code::operator=(in_stack_fffffffffffffe60,__e);
  *(undefined1 *)(in_RDI + 8) = 0;
LAB_003d84ea:
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void read_decimal_fraction(string_type& result, std::error_code& ec)
    {
        std::size_t size = get_size(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        if (size != 2)
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }

        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        int64_t exponent = 0;
        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                exponent = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                exponent = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_decimal_fraction;
                more_ = false;
                return;
            }
        }

        string_type str(alloc_);

        c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }

        switch (get_major_type(c.value))
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                jsoncons::detail::from_integer(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                jsoncons::detail::from_integer(val, str);
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                uint8_t b;
                if (source_.read(&b, 1) == 0)
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }
                uint8_t tag = get_additional_information_value(b);
                c = source_.peek();
                if (JSONCONS_UNLIKELY(c.eof))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return;
                }

                if (get_major_type(c.value) == jsoncons::cbor::detail::cbor_major_type::byte_string)
                {
                    bytes_buffer_.clear();
                    read_byte_string(bytes_buffer_, ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        more_ = false;
                        return;
                    }
                    if (tag == 2)
                    {
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n.write_string(str);
                    }
                    else if (tag == 3)
                    {
                        bigint n = bigint::from_bytes_be(1, bytes_buffer_.data(), bytes_buffer_.size());
                        n = -1 - n;
                        n.write_string(str);
                    }
                }
                break;
            }
            default:
            {
                ec = cbor_errc::invalid_decimal_fraction;
                more_ = false;
                return;
            }
        }

        if (str.size() >= static_cast<std::size_t>((std::numeric_limits<int32_t>::max)()) || 
            exponent >= (std::numeric_limits<int32_t>::max)() || 
            exponent <= (std::numeric_limits<int32_t>::min)())
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }
        else if (str.size() > 0)
        {
            if (str[0] == '-')
            {
                result.push_back('-');
                jsoncons::detail::prettify_string(str.c_str()+1, str.size()-1, (int)exponent, -4, 17, result);
            }
            else
            {
                jsoncons::detail::prettify_string(str.c_str(), str.size(), (int)exponent, -4, 17, result);
            }
        }
        else
        {
            ec = cbor_errc::invalid_decimal_fraction;
            more_ = false;
            return;
        }
    }